

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_parser.cc
# Opt level: O1

void __thiscall iqxmlrpc::ValueBuilder::do_visit_element(ValueBuilder *this,string *tagname)

{
  Parser *pPVar1;
  Value_type *pVVar2;
  int iVar3;
  Value_type *pVVar4;
  BuilderBase local_88;
  Value_type *local_70;
  StateMachine local_68;
  Value_type *local_50;
  undefined8 local_48;
  Value_type local_40 [2];
  undefined8 local_30;
  Value_type *local_28;
  
  iVar3 = StateMachine::change(&this->state_,tagname);
  if (iVar3 == 10) {
    pVVar4 = (Value_type *)operator_new(0x10);
    pVVar4->_vptr_Value_type = (_func_int **)0x0;
    pVVar4[1]._vptr_Value_type = (_func_int **)0x0;
    pVVar4->_vptr_Value_type = (_func_int **)&PTR__Value_type_0018c0d8;
  }
  else if (iVar3 == 9) {
    pPVar1 = (this->super_ValueBuilderBase).super_BuilderBase.parser_;
    BuilderBase::BuilderBase(&local_88,pPVar1,false);
    local_70 = (Value_type *)0x0;
    local_88._vptr_BuilderBase = (_func_int **)&PTR_do_visit_element_0018be98;
    StateMachine::StateMachine(&local_68,pPVar1,0);
    local_50 = (Value_type *)0x0;
    StateMachine::set_transitions
              (&local_68,
               (StateTransition *)
               (anonymous_namespace)::ArrayBuilder::ArrayBuilder(iqxmlrpc::Parser&)::trans);
    local_50 = (Value_type *)operator_new(0x20);
    local_50->_vptr_Value_type = (_func_int **)&PTR__Array_0018bfc8;
    local_50[1]._vptr_Value_type = (_func_int **)0x0;
    local_50[2]._vptr_Value_type = (_func_int **)0x0;
    local_50[3]._vptr_Value_type = (_func_int **)0x0;
    pVVar4 = local_70;
    if ((local_70 != local_50) && (pVVar4 = local_50, local_70 != (Value_type *)0x0)) {
      (*local_70->_vptr_Value_type[1])();
    }
    local_70 = pVVar4;
    BuilderBase::build(&local_88,true);
    pVVar4 = local_70;
  }
  else {
    if (iVar3 != 8) goto LAB_0016a5a9;
    pPVar1 = (this->super_ValueBuilderBase).super_BuilderBase.parser_;
    BuilderBase::BuilderBase(&local_88,pPVar1,false);
    local_70 = (Value_type *)0x0;
    local_88._vptr_BuilderBase = (_func_int **)&PTR_do_visit_element_0018be18;
    StateMachine::StateMachine(&local_68,pPVar1,0);
    local_48 = 0;
    local_40[0]._vptr_Value_type._0_1_ = 0;
    local_30 = 0;
    local_50 = local_40;
    StateMachine::set_transitions
              (&local_68,
               (StateTransition *)
               (anonymous_namespace)::StructBuilder::StructBuilder(iqxmlrpc::Parser&)::trans);
    local_28 = (Value_type *)operator_new(0x38);
    local_28->_vptr_Value_type = (_func_int **)&PTR__Struct_0018c000;
    *(undefined4 *)&local_28[2]._vptr_Value_type = 0;
    local_28[3]._vptr_Value_type = (_func_int **)0x0;
    local_28[4]._vptr_Value_type = (_func_int **)(local_28 + 2);
    local_28[5]._vptr_Value_type = (_func_int **)(local_28 + 2);
    local_28[6]._vptr_Value_type = (_func_int **)0x0;
    pVVar4 = local_70;
    if ((local_70 != local_28) && (pVVar4 = local_28, local_70 != (Value_type *)0x0)) {
      (*local_70->_vptr_Value_type[1])();
    }
    local_70 = pVVar4;
    BuilderBase::build(&local_88,true);
    pVVar4 = local_70;
    local_70 = (Value_type *)0x0;
    local_88._vptr_BuilderBase = (_func_int **)&PTR_do_visit_element_0018be18;
    if (local_50 != local_40) {
      operator_delete(local_50,CONCAT71(local_40[0]._vptr_Value_type._1_7_,
                                        local_40[0]._vptr_Value_type._0_1_) + 1);
    }
    local_88._vptr_BuilderBase = (_func_int **)&PTR___cxa_pure_virtual_0018b508;
    if (local_70 != (Value_type *)0x0) {
      (*local_70->_vptr_Value_type[1])();
    }
  }
  pVVar2 = (this->super_ValueBuilderBase).retval._M_ptr;
  if (pVVar2 != pVVar4) {
    if (pVVar2 != (Value_type *)0x0) {
      (*pVVar2->_vptr_Value_type[1])();
    }
    (this->super_ValueBuilderBase).retval._M_ptr = pVVar4;
  }
LAB_0016a5a9:
  if ((this->super_ValueBuilderBase).retval._M_ptr != (Value_type *)0x0) {
    (this->super_ValueBuilderBase).super_BuilderBase.want_exit_ = true;
  }
  return;
}

Assistant:

void
ValueBuilder::do_visit_element(const std::string& tagname)
{
  switch (state_.change(tagname)) {
  case STRUCT:
    retval.reset(sub_build<Value_type*, StructBuilder>(true));
    break;

  case ARRAY:
    retval.reset(sub_build<Value_type*, ArrayBuilder>(true));
    break;

  case NIL:
    retval.reset(new Nil());
    break;

  default:
    // wait for text within <i4>...</i4>, etc...
    break;
  }

  if (retval.get())
    want_exit();
}